

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

__pid_t __thiscall
kj::Promise<kj::Own<kj::AsyncIoStream>_>::wait
          (Promise<kj::Own<kj::AsyncIoStream>_> *this,void *__stat_loc)

{
  Own<kj::_::PromiseNode> *node;
  Own<kj::AsyncIoStream> *pOVar1;
  Exception *pEVar2;
  AsyncIoStream *in_RDX;
  Exception *exception_1;
  Exception *exception;
  Own<kj::AsyncIoStream> *value;
  undefined1 local_190 [8];
  ExceptionOr<kj::Own<kj::AsyncIoStream>_> result;
  WaitScope *waitScope_local;
  Promise<kj::Own<kj::AsyncIoStream>_> *this_local;
  
  result.value.ptr.ptr = in_RDX;
  _::ExceptionOr<kj::Own<kj::AsyncIoStream>_>::ExceptionOr
            ((ExceptionOr<kj::Own<kj::AsyncIoStream>_> *)local_190);
  node = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)__stat_loc);
  _::waitImpl(node,(ExceptionOrValue *)local_190,(WaitScope *)result.value.ptr.ptr);
  pOVar1 = _::readMaybe<kj::AsyncIoStream>
                     ((Maybe<kj::Own<kj::AsyncIoStream>_> *)
                      ((long)&result.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
  if (pOVar1 != (Own<kj::AsyncIoStream> *)0x0) {
    pEVar2 = _::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_190);
    if (pEVar2 != (Exception *)0x0) {
      pEVar2 = mv<kj::Exception>(pEVar2);
      throwRecoverableException(pEVar2,0);
    }
    pOVar1 = mv<kj::Own<kj::AsyncIoStream>>(pOVar1);
    pOVar1 = _::returnMaybeVoid<kj::Own<kj::AsyncIoStream>>(pOVar1);
    Own<kj::AsyncIoStream>::Own((Own<kj::AsyncIoStream> *)this,pOVar1);
    _::ExceptionOr<kj::Own<kj::AsyncIoStream>_>::~ExceptionOr
              ((ExceptionOr<kj::Own<kj::AsyncIoStream>_> *)local_190);
    return (__pid_t)this;
  }
  pEVar2 = _::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_190);
  if (pEVar2 != (Exception *)0x0) {
    pEVar2 = mv<kj::Exception>(pEVar2);
    throwFatalException(pEVar2,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }